

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O0

c8 * __thiscall irr::COSOperator::getTextFromClipboard(COSOperator *this)

{
  undefined8 uVar1;
  long in_RDI;
  
  SDL_free(*(undefined8 *)(in_RDI + 0x28));
  uVar1 = SDL_GetClipboardText();
  *(undefined8 *)(in_RDI + 0x28) = uVar1;
  return *(c8 **)(in_RDI + 0x28);
}

Assistant:

const c8 *COSOperator::getTextFromClipboard() const
{
#if defined(_IRR_COMPILE_WITH_SDL_DEVICE_)
	SDL_free(ClipboardSelectionText);
	ClipboardSelectionText = SDL_GetClipboardText();
	return ClipboardSelectionText;

#elif defined(_IRR_WINDOWS_API_)
	if (!OpenClipboard(NULL))
		return 0;

	HANDLE hData = GetClipboardData(CF_UNICODETEXT);
	if (hData == NULL) // Probably not in Unicode text format
		return 0;

	wchar_t *buffer = (wchar_t *)GlobalLock(hData);

	core::wStringToUTF8(ClipboardBuf, buffer);

	GlobalUnlock(hData);
	CloseClipboard();

	return ClipboardBuf.c_str();

#elif defined(_IRR_COMPILE_WITH_OSX_DEVICE_)
	NSString *str = nil;
	NSPasteboard *board = nil;
	char *result = 0;

	board = [NSPasteboard generalPasteboard];
	str = [board stringForType:NSStringPboardType];

	if (str != nil)
		result = (char *)[str cStringUsingEncoding:NSUTF8StringEncoding];

	return (result);

#elif defined(_IRR_COMPILE_WITH_X11_DEVICE_)
	if (IrrDeviceLinux)
		return IrrDeviceLinux->getTextFromClipboard();
	return 0;

#else

	return 0;
#endif
}